

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O3

void ProcessRows(VP8LDecoder *dec,int row)

{
  WEBP_CSP_MODE out_colorspace;
  int width;
  VP8Io *pVVar1;
  WebPDecBuffer *pWVar2;
  WebPRescaler *pWVar3;
  int iVar4;
  int iVar5;
  uint8_t *rgba;
  uint uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint8_t *rgba_00;
  int iVar12;
  uint32_t *puVar13;
  uint32_t *puVar14;
  int local_70;
  
  iVar12 = dec->last_row;
  if (row - iVar12 != 0 && iVar12 <= row) {
    pVVar1 = dec->io;
    puVar13 = dec->argb_cache;
    iVar9 = pVVar1->width;
    ApplyInverseTransforms(dec,iVar12,row - iVar12,dec->pixels + (long)dec->width * (long)iVar12);
    iVar12 = dec->last_row;
    iVar4 = pVVar1->crop_bottom;
    if (row <= pVVar1->crop_bottom) {
      iVar4 = row;
    }
    iVar11 = pVVar1->crop_top;
    iVar5 = iVar12;
    if (iVar11 - iVar12 != 0 && iVar12 <= iVar11) {
      iVar5 = iVar11;
    }
    iVar8 = iVar4 - iVar5;
    if (iVar8 != 0 && iVar5 <= iVar4) {
      iVar9 = iVar9 * 4;
      iVar10 = 0;
      if (iVar12 < iVar11) {
        iVar10 = (iVar11 - iVar12) * iVar9;
      }
      puVar13 = (uint32_t *)((long)puVar13 + (long)pVVar1->crop_left * 4 + (long)iVar10);
      pVVar1->mb_y = iVar5 - iVar11;
      iVar12 = pVVar1->crop_right - pVVar1->crop_left;
      pVVar1->mb_w = iVar12;
      pVVar1->mb_h = iVar8;
      pWVar2 = dec->output;
      out_colorspace = pWVar2->colorspace;
      if (out_colorspace < MODE_YUV) {
        lVar7 = (long)(pWVar2->u).RGBA.stride;
        rgba = (pWVar2->u).RGBA.rgba + dec->last_out_row * lVar7;
        if (pVVar1->use_scaling == 0) {
          local_70 = iVar8;
          if (0 < iVar8) {
            uVar6 = (iVar4 - iVar5) + 1;
            do {
              VP8LConvertFromBGRA(puVar13,iVar12,out_colorspace,rgba);
              puVar13 = (uint32_t *)((long)puVar13 + (long)iVar9);
              rgba = rgba + lVar7;
              uVar6 = uVar6 - 1;
            } while (1 < uVar6);
          }
        }
        else if (iVar8 < 1) {
          local_70 = 0;
        }
        else {
          iVar12 = 0;
          local_70 = 0;
          do {
            puVar14 = (uint32_t *)((long)iVar12 * (long)iVar9 + (long)puVar13);
            iVar4 = WebPRescaleNeededLines(dec->rescaler,iVar8 - iVar12);
            WebPMultARGBRows((uint8_t *)puVar14,iVar9,dec->rescaler->src_width,iVar4,0);
            iVar4 = WebPRescalerImport(dec->rescaler,iVar8 - iVar12,(uint8_t *)puVar14,iVar9);
            pWVar3 = dec->rescaler;
            iVar11 = 0;
            if (pWVar3->dst_y < pWVar3->dst_height) {
              puVar14 = (uint32_t *)pWVar3->dst;
              iVar5 = pWVar3->dst_width;
              rgba_00 = rgba + local_70 * lVar7;
              iVar11 = 0;
              do {
                if (0 < pWVar3->y_accum) break;
                WebPRescalerExportRow(pWVar3);
                (*WebPMultARGBRow)(puVar14,iVar5,1);
                VP8LConvertFromBGRA(puVar14,iVar5,out_colorspace,rgba_00);
                rgba_00 = rgba_00 + lVar7;
                iVar11 = iVar11 + 1;
              } while (pWVar3->dst_y < pWVar3->dst_height);
            }
            iVar12 = iVar12 + iVar4;
            local_70 = local_70 + iVar11;
          } while (iVar12 < iVar8);
        }
        dec->last_out_row = dec->last_out_row + local_70;
      }
      else {
        iVar11 = dec->last_out_row;
        if (pVVar1->use_scaling == 0) {
          if (0 < iVar8) {
            uVar6 = (iVar4 - iVar5) + 1;
            do {
              ConvertToYUVA(puVar13,iVar12,iVar11,dec->output);
              puVar13 = (uint32_t *)((long)puVar13 + (long)iVar9);
              iVar11 = iVar11 + 1;
              uVar6 = uVar6 - 1;
            } while (1 < uVar6);
          }
        }
        else if (0 < iVar8) {
          iVar12 = 0;
          do {
            iVar4 = WebPRescaleNeededLines(dec->rescaler,iVar8 - iVar12);
            WebPMultARGBRows((uint8_t *)puVar13,iVar9,dec->rescaler->src_width,iVar4,0);
            iVar5 = WebPRescalerImport(dec->rescaler,iVar8 - iVar12,(uint8_t *)puVar13,iVar9);
            pWVar3 = dec->rescaler;
            iVar10 = 0;
            if (pWVar3->dst_y < pWVar3->dst_height) {
              puVar14 = (uint32_t *)pWVar3->dst;
              width = pWVar3->dst_width;
              do {
                if (0 < pWVar3->y_accum) break;
                WebPRescalerExportRow(pWVar3);
                (*WebPMultARGBRow)(puVar14,width,1);
                ConvertToYUVA(puVar14,width,iVar11 + iVar10,dec->output);
                iVar10 = iVar10 + 1;
              } while (pWVar3->dst_y < pWVar3->dst_height);
            }
            iVar12 = iVar12 + iVar5;
            puVar13 = (uint32_t *)((long)puVar13 + (long)(iVar4 * iVar9));
            iVar11 = iVar10 + iVar11;
          } while (iVar12 < iVar8);
        }
        dec->last_out_row = iVar11;
      }
    }
  }
  dec->last_row = row;
  return;
}

Assistant:

static void ProcessRows(VP8LDecoder* const dec, int row) {
  const uint32_t* const rows = dec->pixels + dec->width * dec->last_row;
  const int num_rows = row - dec->last_row;

  assert(row <= dec->io->crop_bottom);
  // We can't process more than NUM_ARGB_CACHE_ROWS at a time (that's the size
  // of argb_cache), but we currently don't need more than that.
  assert(num_rows <= NUM_ARGB_CACHE_ROWS);
  if (num_rows > 0) {    // Emit output.
    VP8Io* const io = dec->io;
    uint8_t* rows_data = (uint8_t*)dec->argb_cache;
    const int in_stride = io->width * sizeof(uint32_t);  // in unit of RGBA
    ApplyInverseTransforms(dec, dec->last_row, num_rows, rows);
    if (!SetCropWindow(io, dec->last_row, row, &rows_data, in_stride)) {
      // Nothing to output (this time).
    } else {
      const WebPDecBuffer* const output = dec->output;
      if (WebPIsRGBMode(output->colorspace)) {  // convert to RGBA
        const WebPRGBABuffer* const buf = &output->u.RGBA;
        uint8_t* const rgba =
            buf->rgba + (ptrdiff_t)dec->last_out_row * buf->stride;
        const int num_rows_out =
#if !defined(WEBP_REDUCE_SIZE)
         io->use_scaling ?
            EmitRescaledRowsRGBA(dec, rows_data, in_stride, io->mb_h,
                                 rgba, buf->stride) :
#endif  // WEBP_REDUCE_SIZE
            EmitRows(output->colorspace, rows_data, in_stride,
                     io->mb_w, io->mb_h, rgba, buf->stride);
        // Update 'last_out_row'.
        dec->last_out_row += num_rows_out;
      } else {                              // convert to YUVA
        dec->last_out_row = io->use_scaling ?
            EmitRescaledRowsYUVA(dec, rows_data, in_stride, io->mb_h) :
            EmitRowsYUVA(dec, rows_data, in_stride, io->mb_w, io->mb_h);
      }
      assert(dec->last_out_row <= output->height);
    }
  }

  // Update 'last_row'.
  dec->last_row = row;
  assert(dec->last_row <= dec->height);
}